

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O2

vector<char,_std::allocator<char>_> *
cnpy::operator+=(vector<char,_std::allocator<char>_> *lhs,unsigned_short rhs)

{
  size_t byte;
  long lVar1;
  char val;
  value_type local_1b;
  unsigned_short local_1a;
  
  local_1a = rhs;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    local_1b = *(value_type *)((long)&local_1a + lVar1);
    std::vector<char,_std::allocator<char>_>::push_back(lhs,&local_1b);
  }
  return lhs;
}

Assistant:

std::vector<char>& operator+=(std::vector<char>& lhs, const T rhs) {
        //write in little endian
        for(size_t byte = 0; byte < sizeof(T); byte++) {
            char val = *((char*)&rhs+byte); 
            lhs.push_back(val);
        }
        return lhs;
    }